

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::TrimCapabilitiesPass::AddExtensionsForOperand
          (TrimCapabilitiesPass *this,spv_operand_type_t type,uint32_t value,
          ExtensionSet *extensions)

{
  spv_result_t sVar1;
  IRContext *this_00;
  AssemblyGrammar *this_01;
  spv_operand_desc_t *psStack_28;
  spv_result_t result;
  spv_operand_desc_t *desc;
  ExtensionSet *extensions_local;
  uint32_t value_local;
  spv_operand_type_t type_local;
  TrimCapabilitiesPass *this_local;
  
  psStack_28 = (spv_operand_desc_t *)0x0;
  desc = (spv_operand_desc_t *)extensions;
  extensions_local._0_4_ = value;
  extensions_local._4_4_ = type;
  _value_local = this;
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::grammar(this_00);
  sVar1 = AssemblyGrammar::lookupOperand
                    (this_01,extensions_local._4_4_,(uint32_t)extensions_local,
                     &stack0xffffffffffffffd8);
  if (sVar1 == SPV_SUCCESS) {
    addSupportedExtensionsToSet<spv_operand_desc_t>(this,psStack_28,(ExtensionSet *)desc);
  }
  return;
}

Assistant:

void TrimCapabilitiesPass::AddExtensionsForOperand(
    const spv_operand_type_t type, const uint32_t value,
    ExtensionSet* extensions) const {
  const spv_operand_desc_t* desc = nullptr;
  spv_result_t result = context()->grammar().lookupOperand(type, value, &desc);
  if (result != SPV_SUCCESS) {
    return;
  }
  addSupportedExtensionsToSet(desc, extensions);
}